

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5UnicodeCategory(u32 iCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = 0;
  if (iCode < 0x100000) {
    uVar2 = (uint)aFts5UnicodeBlock[iCode >> 0x10];
    uVar3 = (uint)aFts5UnicodeBlock[(ulong)(iCode >> 0x10) + 1];
    uVar5 = 0xffffffff;
    if (aFts5UnicodeBlock[iCode >> 0x10] < aFts5UnicodeBlock[(ulong)(iCode >> 0x10) + 1]) {
      uVar5 = 0xffffffff;
      do {
        uVar4 = uVar3 + uVar2 >> 1;
        uVar1 = uVar4;
        if ((uint)*(ushort *)((long)aFts5UnicodeMap + (ulong)(uVar3 + uVar2 & 0xfffffffe)) <=
            (iCode & 0xffff)) {
          uVar2 = uVar4 + 1;
          uVar1 = uVar3;
          uVar5 = uVar4;
        }
        uVar3 = uVar1;
      } while ((int)uVar2 < (int)uVar3);
    }
    uVar2 = 0;
    if (-1 < (int)uVar5) {
      if (((iCode & 0xffff) < (uint)(aFts5UnicodeData[uVar5] >> 5) + (uint)aFts5UnicodeMap[uVar5])
         && (uVar2 = aFts5UnicodeData[uVar5] & 0x1f, uVar2 == 0x1e)) {
        uVar2 = (uint)((iCode - aFts5UnicodeMap[uVar5] & 1) == 0) * 4 + 5;
      }
    }
  }
  return uVar2;
}

Assistant:

static int sqlite3Fts5UnicodeCategory(u32 iCode) { 
  int iRes = -1;
  int iHi;
  int iLo;
  int ret;
  u16 iKey;

  if( iCode>=(1<<20) ){
    return 0;
  }
  iLo = aFts5UnicodeBlock[(iCode>>16)];
  iHi = aFts5UnicodeBlock[1+(iCode>>16)];
  iKey = (iCode & 0xFFFF);
  while( iHi>iLo ){
    int iTest = (iHi + iLo) / 2;
    assert( iTest>=iLo && iTest<iHi );
    if( iKey>=aFts5UnicodeMap[iTest] ){
      iRes = iTest;
      iLo = iTest+1;
    }else{
      iHi = iTest;
    }
  }

  if( iRes<0 ) return 0;
  if( iKey>=(aFts5UnicodeMap[iRes]+(aFts5UnicodeData[iRes]>>5)) ) return 0;
  ret = aFts5UnicodeData[iRes] & 0x1F;
  if( ret!=30 ) return ret;
  return ((iKey - aFts5UnicodeMap[iRes]) & 0x01) ? 5 : 9;
}